

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  bool local_89;
  undefined1 local_68 [8];
  CodedInputStream decoder;
  ZeroCopyInputStream *input_local;
  MessageLite *this_local;
  
  decoder.extension_factory_ = (MessageFactory *)input;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_68,input);
  bVar1 = ParsePartialFromCodedStream(this,(CodedInputStream *)local_68);
  local_89 = false;
  if (bVar1) {
    local_89 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_68);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_68);
  return local_89;
}

Assistant:

bool MessageLite::ParsePartialFromZeroCopyStream(
    io::ZeroCopyInputStream* input) {
  io::CodedInputStream decoder(input);
  return ParsePartialFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage();
}